

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::AppendLinkDepends
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  cmGeneratorTarget *pcVar1;
  string *psVar2;
  ModuleDefinitionInfo *pMVar3;
  char *pcVar4;
  pointer ppcVar5;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  allocator local_59;
  string local_58;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_38;
  
  AppendObjectDepends(this,depends);
  AppendTargetDepends(this,depends);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  pMVar3 = cmGeneratorTarget::GetModuleDefinitionInfo(pcVar1,psVar2);
  if (pMVar3 != (ModuleDefinitionInfo *)0x0) {
    for (ppcVar5 = (pMVar3->Sources).
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar5 !=
        (pMVar3->Sources).
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
      psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(depends,psVar2);
    }
  }
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmGeneratorTarget::GetManifests
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_38,
             &(this->super_cmCommonTargetGenerator).ConfigName);
  for (ppcVar5 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 != local_38._M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(depends,psVar2);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_58,"LINK_DEPENDS",&local_59);
  pcVar4 = cmGeneratorTarget::GetProperty(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_58,pcVar4,&local_59);
    cmSystemTools::ExpandListArgument(&local_58,depends,false);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AppendLinkDepends(
  std::vector<std::string>& depends)
{
  this->AppendObjectDepends(depends);

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the link definitions file, if any.
  if (cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
        this->GeneratorTarget->GetModuleDefinitionInfo(
          this->GetConfigName())) {
    for (std::vector<cmSourceFile const*>::const_iterator i =
           mdi->Sources.begin();
         i != mdi->Sources.end(); ++i) {
      depends.push_back((*i)->GetFullPath());
    }
  }

  // Add a dependency on user-specified manifest files, if any.
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, this->ConfigName);
  for (std::vector<cmSourceFile const*>::iterator mi = manifest_srcs.begin();
       mi != manifest_srcs.end(); ++mi) {
    depends.push_back((*mi)->GetFullPath());
  }

  // Add user-specified dependencies.
  if (const char* linkDepends =
        this->GeneratorTarget->GetProperty("LINK_DEPENDS")) {
    cmSystemTools::ExpandListArgument(linkDepends, depends);
  }
}